

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_decode_scanline(spng_ctx *ctx,void *out,size_t len)

{
  size_t rowbytes;
  ushort *puVar1;
  spng_subimage *psVar2;
  ushort uVar3;
  ushort uVar4;
  spng_format fmt;
  uint width;
  uint32_t uVar5;
  undefined4 uVar6;
  uint16_t *puVar7;
  size_t len_00;
  uchar *puVar8;
  ushort uVar9;
  ushort uVar10;
  bool bVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  byte bVar16;
  byte bVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  size_t sVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  byte *pbVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  uchar *row;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  byte *pbVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  char cVar48;
  byte bVar49;
  char cVar50;
  byte bVar51;
  char cVar52;
  byte bVar53;
  char cVar54;
  byte bVar55;
  char cVar56;
  byte bVar57;
  char cVar58;
  byte bVar59;
  char cVar60;
  byte bVar61;
  char cVar62;
  byte bVar63;
  char cVar64;
  byte bVar65;
  char cVar66;
  byte bVar67;
  char cVar68;
  byte bVar69;
  char cVar70;
  byte bVar71;
  char cVar72;
  byte bVar73;
  char cVar74;
  byte bVar75;
  char cVar76;
  byte bVar77;
  char cVar78;
  byte bVar79;
  uint local_ac;
  ulong local_98;
  byte *local_68;
  
  if (out == (void *)0x0 || ctx == (spng_ctx *)0x0) {
    return 1;
  }
  if (SPNG_STATE_DECODE_INIT < ctx->state) {
    return 0x4b;
  }
  bVar16 = (ctx->ihdr).bit_depth;
  uVar3 = *(ushort *)&ctx->decode_flags;
  iVar25 = (ctx->row_info).pass;
  fmt = ctx->fmt;
  uVar26 = (uint)bVar16;
  uVar24 = 8;
  if ((uVar3 & 8) == 0) {
    uVar24 = uVar26;
  }
  lVar42 = 8;
  if (fmt != SPNG_FMT_RGBA16) {
    lVar42 = (ulong)(fmt != SPNG_FMT_RGB8) + 3;
  }
  if (len < ctx->subimage[iVar25].out_width) {
    return 0x42;
  }
  puVar7 = ctx->gamma_lut;
  local_68 = ctx->scanline;
  psVar2 = ctx->subimage + iVar25;
  len_00 = psVar2->scanline_width;
  width = psVar2->width;
  uVar32 = (ulong)width;
  uVar5 = (ctx->row_info).scanline_idx;
  if ((uVar5 == psVar2->height - 1) && (iVar25 == ctx->last_pass)) {
    uVar22 = read_scanline_bytes(ctx,local_68,len_00 - 1);
    bVar17 = 0;
  }
  else {
    uVar22 = read_scanline_bytes(ctx,local_68,len_00);
    if (uVar22 != 0) goto LAB_00102718;
    bVar17 = ctx->scanline[len_00 - 1];
    uVar22 = 0x41;
    if (bVar17 < 5) {
      uVar22 = 0;
    }
  }
  if (uVar22 != 0) goto LAB_00102718;
  if ((uVar5 == 0) && (1 < (ctx->row_info).filter)) {
    memset(ctx->prev_scanline,0,len_00);
  }
  if ((((ctx->ihdr).bit_depth == '\x10') && (ctx->fmt != SPNG_FMT_RAW)) && (1 < len_00 - 1)) {
    puVar8 = ctx->scanline;
    uVar33 = 0;
    do {
      puVar1 = (ushort *)(puVar8 + uVar33 * 2);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar33 = uVar33 + 1;
    } while (len_00 - 1 >> 1 != uVar33);
  }
  bVar11 = false;
  uVar22 = 0x50;
  if (((len_00 != 0) && (puVar8 = ctx->prev_scanline, puVar8 != (uchar *)0x0)) &&
     (row = ctx->scanline, row != (uchar *)0x0)) {
    bVar49 = (ctx->row_info).filter;
    bVar11 = true;
    uVar22 = (uint)bVar49;
    if (bVar49 != 0) {
      rowbytes = len_00 - 1;
      if (uVar22 == 2) {
        if (rowbytes == 0) {
LAB_00102706:
          bVar11 = true;
          uVar22 = 0;
        }
        else {
          uVar22 = 0;
          sVar27 = 0;
          do {
            row[sVar27] = row[sVar27] + puVar8[sVar27];
            sVar27 = sVar27 + 1;
          } while (rowbytes != sVar27);
        }
      }
      else {
        uVar33 = (ulong)ctx->bytes_per_pixel;
        if (uVar33 == 3) {
          if (bVar49 != 4) {
            if (bVar49 == 3) {
              defilter_avg3(rowbytes,row,puVar8);
            }
            else {
              if (uVar22 != 1) {
LAB_00102691:
                bVar11 = false;
                uVar22 = 0x41;
                goto LAB_00102709;
              }
              defilter_sub3(rowbytes,row);
            }
            goto LAB_00102706;
          }
          defilter_paeth3(rowbytes,row,puVar8);
LAB_00103478:
          bVar11 = true;
          uVar22 = 0;
        }
        else if (ctx->bytes_per_pixel == 4) {
          if (bVar49 == 4) {
            defilter_paeth4(rowbytes,row,puVar8);
            goto LAB_00103478;
          }
          if (bVar49 == 3) {
            uVar33 = len_00 + 3;
            if (uVar33 < 5) goto LAB_00102706;
            bVar49 = 0;
            bVar51 = 0;
            bVar53 = 0;
            bVar55 = 0;
            bVar57 = 0;
            bVar59 = 0;
            bVar61 = 0;
            bVar63 = 0;
            bVar65 = 0;
            bVar67 = 0;
            bVar69 = 0;
            bVar71 = 0;
            bVar73 = 0;
            bVar75 = 0;
            bVar77 = 0;
            bVar79 = 0;
            lVar41 = 0;
            do {
              pbVar43 = puVar8 + lVar41;
              uVar6 = *(undefined4 *)(row + lVar41);
              cVar48 = pavgb(bVar49,*pbVar43);
              cVar50 = pavgb(bVar51,pbVar43[1]);
              cVar52 = pavgb(bVar53,pbVar43[2]);
              cVar54 = pavgb(bVar55,pbVar43[3]);
              cVar56 = pavgb(bVar57,0);
              cVar58 = pavgb(bVar59,0);
              cVar60 = pavgb(bVar61,0);
              cVar62 = pavgb(bVar63,0);
              cVar64 = pavgb(bVar65,0);
              cVar66 = pavgb(bVar67,0);
              cVar68 = pavgb(bVar69,0);
              cVar70 = pavgb(bVar71,0);
              cVar72 = pavgb(bVar73,0);
              cVar74 = pavgb(bVar75,0);
              cVar76 = pavgb(bVar77,0);
              cVar78 = pavgb(bVar79,0);
              bVar57 = cVar56 - (bVar57 & 1);
              bVar59 = cVar58 - (bVar59 & 1);
              bVar61 = cVar60 - (bVar61 & 1);
              bVar63 = cVar62 - (bVar63 & 1);
              bVar65 = cVar64 - (bVar65 & 1);
              bVar67 = cVar66 - (bVar67 & 1);
              bVar69 = cVar68 - (bVar69 & 1);
              bVar71 = cVar70 - (bVar71 & 1);
              bVar73 = cVar72 - (bVar73 & 1);
              bVar75 = cVar74 - (bVar75 & 1);
              bVar77 = cVar76 - (bVar77 & 1);
              bVar79 = cVar78 - (bVar79 & 1);
              bVar49 = (cVar48 - ((bVar49 ^ *pbVar43) & 1)) + (char)uVar6;
              bVar51 = (cVar50 - ((bVar51 ^ pbVar43[1]) & 1)) + (char)((uint)uVar6 >> 8);
              bVar53 = (cVar52 - ((bVar53 ^ pbVar43[2]) & 1)) + (char)((uint)uVar6 >> 0x10);
              bVar55 = (cVar54 - ((bVar55 ^ pbVar43[3]) & 1)) + (char)((uint)uVar6 >> 0x18);
              pbVar43 = row + lVar41;
              *pbVar43 = bVar49;
              pbVar43[1] = bVar51;
              pbVar43[2] = bVar53;
              pbVar43[3] = bVar55;
              uVar33 = uVar33 - 4;
              lVar41 = lVar41 + 4;
              uVar22 = 0;
            } while (4 < uVar33);
          }
          else {
            if (bVar49 != 1) goto LAB_00102691;
            uVar33 = len_00 + 3;
            uVar22 = 0;
            if (4 < uVar33) {
              uVar44 = '\0';
              uVar45 = '\0';
              uVar46 = '\0';
              uVar47 = '\0';
              do {
                uVar6 = *(undefined4 *)row;
                uVar44 = uVar44 + (char)uVar6;
                uVar45 = uVar45 + (char)((uint)uVar6 >> 8);
                uVar46 = uVar46 + (char)((uint)uVar6 >> 0x10);
                uVar47 = uVar47 + (char)((uint)uVar6 >> 0x18);
                *row = uVar44;
                row[1] = uVar45;
                row[2] = uVar46;
                row[3] = uVar47;
                row = row + 4;
                uVar33 = uVar33 - 4;
                uVar22 = 0;
              } while (4 < uVar33);
            }
          }
        }
        else {
          if (rowbytes == 0) goto LAB_00102706;
          uVar38 = 0;
          do {
            if (uVar38 < uVar33) {
              bVar51 = 0;
              uVar22 = 0;
            }
            else {
              bVar51 = row[uVar38 - uVar33];
              uVar22 = (uint)puVar8[uVar38 - uVar33];
            }
            bVar53 = puVar8[uVar38];
            uVar44 = row[uVar38];
            if (bVar49 == 4) {
              uVar39 = bVar51 - uVar22;
              uVar29 = bVar53 - uVar22;
              uVar31 = -uVar29;
              if (0 < (int)uVar29) {
                uVar31 = uVar29;
              }
              uVar29 = -uVar39;
              if (0 < (int)uVar39) {
                uVar29 = uVar39;
              }
              uVar36 = (uVar39 + bVar53) - uVar22;
              uVar39 = -uVar36;
              if (0 < (int)uVar36) {
                uVar39 = uVar36;
              }
              if ((uVar29 & 0xff) <= (uVar39 & 0xffff)) {
                uVar22 = (uint)bVar53;
              }
              if ((uVar39 & 0xffff) < (uVar31 & 0xffff)) {
                bVar51 = (byte)uVar22;
              }
              if ((uVar29 & 0xff) < (uVar31 & 0xffff)) {
                bVar51 = (byte)uVar22;
              }
              uVar44 = bVar51 + uVar44;
            }
            else if (bVar49 == 3) {
              uVar44 = uVar44 + (char)((uint)bVar53 + (uint)bVar51 >> 1);
            }
            else if (bVar49 == 1) {
              uVar44 = uVar44 + bVar51;
            }
            row[uVar38] = uVar44;
            uVar38 = uVar38 + 1;
          } while (rowbytes != uVar38);
          bVar11 = true;
          uVar22 = 0;
        }
      }
    }
  }
LAB_00102709:
  if (bVar11) {
    (ctx->row_info).filter = bVar17;
    uVar22 = 0;
  }
LAB_00102718:
  if (uVar22 == 0) {
    pbVar43 = ctx->scanline;
    if (uVar32 != 0) {
      if ((uVar3 & 0x40) == 0) {
        if ((uVar3 >> 8 & 1) == 0) {
          bVar16 = ~(byte)(-1 << (bVar16 & 0x1f));
          uVar23 = 8 - uVar26;
          uVar38 = 0;
          uVar36 = 0;
          lVar41 = 0;
          local_98 = 0;
          uVar39 = 0;
          local_ac = 0;
          uVar29 = 0;
          uVar33 = 0;
          uVar31 = 0;
          uVar40 = 0;
          uVar22 = uVar23;
          do {
            iVar25 = (int)uVar38;
            bVar17 = (byte)uVar22;
            switch((ctx->ihdr).color_type) {
            case '\0':
              if ((ctx->ihdr).bit_depth != '\x10') {
                bVar49 = *local_68;
                uVar31 = uVar22 - uVar26;
                uVar22 = uVar31;
                if (7 < uVar31) {
                  uVar22 = uVar23;
                }
                local_68 = local_68 + (7 < uVar31);
                bVar17 = bVar49 >> (bVar17 & 0x1f) & bVar16;
                uVar31 = (uint)bVar17;
                uVar36 = uVar31;
                uVar40 = uVar31;
                if (((uVar3 & 1) == 0) || ((ctx->trns).gray != (ushort)bVar17)) {
                  uVar33 = 0xff;
                }
                else {
                  uVar33 = 0;
                }
                break;
              }
              uVar4 = *(ushort *)(pbVar43 + (uint)(iVar25 * 2));
              if (((uVar3 & 1) == 0) || ((ctx->trns).gray != uVar4)) {
                local_98 = 0xffff;
              }
              else {
                local_98 = 0;
              }
LAB_00102a5f:
              uVar29 = (uint)uVar4;
              local_ac = uVar29;
              uVar39 = uVar29;
              goto LAB_00102a85;
            case '\x02':
              if ((ctx->ihdr).bit_depth == '\x10') {
                uVar37 = (ulong)(uint)(iVar25 * 6);
                uVar29 = (uint)*(ushort *)(pbVar43 + uVar37);
                local_ac = (uint)*(ushort *)(pbVar43 + uVar37 + 2);
                uVar39 = (uint)*(ushort *)(pbVar43 + uVar37 + 4);
                local_98 = 0xffff;
                goto LAB_00102a85;
              }
              if (fmt != SPNG_FMT_RGBA8) {
                uVar31 = (uint)pbVar43[uVar38 * 3 + 2 & 0xffffffff];
                uVar33 = 0xff;
                uVar36 = (uint)pbVar43[(uint)(iVar25 * 3)];
                uVar40 = (uint)pbVar43[iVar25 * 3 + 1];
                break;
              }
              uVar26 = 0;
              uVar33 = 0;
              do {
                *(byte *)((long)out + (uVar33 & 0xffffffff) + 2) = pbVar43[(ulong)uVar26 + 2];
                *(undefined2 *)((long)out + (uVar33 & 0xffffffff)) =
                     *(undefined2 *)(pbVar43 + uVar26);
                *(undefined1 *)((long)out + (ulong)((int)uVar33 + 3)) = 0xff;
                uVar33 = uVar33 + 4;
                uVar26 = uVar26 + 3;
              } while (uVar32 * 4 != uVar33);
              goto LAB_00102ccf;
            case '\x03':
              if ((ctx->ihdr).bit_depth == '\b') {
                if ((fmt & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
                  bVar17 = pbVar43[uVar38];
                  goto LAB_00102b4d;
                }
                bVar11 = true;
                if (fmt == SPNG_FMT_RGBA8) {
                  uVar37 = 0;
                  pbVar34 = pbVar43;
                  do {
                    uVar30 = uVar37 & 0xffffffff;
                    uVar28 = (ulong)*pbVar34;
                    *(uchar *)((long)out + uVar30) = ctx->trns_px[uVar28 * 4 + 8];
                    *(uchar *)((long)out + uVar30 + 1) = ctx->trns_px[uVar28 * 4 + 9];
                    *(uchar *)((long)out + uVar30 + 2) = ctx->trns_px[uVar28 * 4 + 10];
                    *(uchar *)((long)out + uVar30 + 3) = ctx->trns_px[uVar28 * 4 + 0xb];
                    uVar37 = uVar37 + 4;
                    pbVar34 = pbVar34 + 1;
                  } while (uVar32 * 4 != uVar37);
LAB_00102c69:
                  bVar11 = true;
                }
                else if (fmt == SPNG_FMT_RGB8) {
                  uVar37 = 0;
                  pbVar34 = pbVar43;
                  do {
                    uVar28 = uVar37 & 0xffffffff;
                    uVar30 = (ulong)*pbVar34;
                    *(uchar *)((long)out + uVar28) = ctx->trns_px[uVar30 * 4 + 8];
                    *(uchar *)((long)out + uVar28 + 1) = ctx->trns_px[uVar30 * 4 + 9];
                    *(uchar *)((long)out + uVar28 + 2) = ctx->trns_px[uVar30 * 4 + 10];
                    uVar37 = uVar37 + 3;
                    pbVar34 = pbVar34 + 1;
                  } while (uVar32 * 3 != uVar37);
                  goto LAB_00102c69;
                }
              }
              else {
                bVar49 = *local_68;
                uVar35 = uVar22 - uVar26;
                uVar22 = uVar35;
                if (7 < uVar35) {
                  uVar22 = uVar23;
                }
                local_68 = local_68 + (7 < uVar35);
                bVar17 = bVar49 >> (bVar17 & 0x1f) & bVar16;
LAB_00102b4d:
                uVar37 = (ulong)bVar17;
                uVar44 = ctx->trns_px[uVar37 * 4 + 8];
                if ((fmt & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
                  uVar4 = CONCAT11(ctx->trns_px[uVar37 * 4 + 9],ctx->trns_px[uVar37 * 4 + 9]);
                  local_ac = (uint)uVar4;
                  uVar9 = CONCAT11(ctx->trns_px[uVar37 * 4 + 10],ctx->trns_px[uVar37 * 4 + 10]);
                  uVar39 = (uint)uVar9;
                  uVar10 = CONCAT11(ctx->trns_px[uVar37 * 4 + 0xb],ctx->trns_px[uVar37 * 4 + 0xb]);
                  uVar29 = (uint)CONCAT11(uVar44,uVar44);
                  *(ushort *)((long)out + lVar41) = CONCAT11(uVar44,uVar44);
                  *(ushort *)((long)out + lVar41 + 2) = uVar4;
                  *(ushort *)((long)out + lVar41 + 4) = uVar9;
                  local_98 = (ulong)uVar10;
                  *(ushort *)((long)out + lVar41 + 6) = uVar10;
                }
                else {
                  *(uchar *)((long)out + lVar41) = uVar44;
                  *(uchar *)((long)out + lVar41 + 1) = ctx->trns_px[uVar37 * 4 + 9];
                  *(uchar *)((long)out + lVar41 + 2) = ctx->trns_px[uVar37 * 4 + 10];
                  if (fmt == SPNG_FMT_RGBA8) {
                    *(uchar *)((long)out + lVar41 + 3) = ctx->trns_px[uVar37 * 4 + 0xb];
                  }
                }
                bVar11 = false;
              }
              if (!bVar11) goto LAB_00102c87;
              goto LAB_00102ccf;
            case '\x04':
              if ((ctx->ihdr).bit_depth == '\x10') {
                uVar4 = *(ushort *)(pbVar43 + (uint)(iVar25 * 4));
                local_98 = (ulong)*(ushort *)(pbVar43 + (ulong)(uint)(iVar25 * 4) + 2);
                goto LAB_00102a5f;
              }
              bVar17 = pbVar43[(uint)(iVar25 * 2)];
              uVar33 = (ulong)pbVar43[(ulong)(uint)(iVar25 * 2) + 1];
              uVar31 = (uint)bVar17;
              uVar36 = (uint)bVar17;
              uVar40 = (uint)bVar17;
              break;
            case '\x06':
              if ((ctx->ihdr).bit_depth == '\x10') {
                uVar37 = (ulong)(uint)(iVar25 * 8);
                uVar29 = (uint)*(ushort *)(pbVar43 + uVar37);
                local_ac = (uint)*(ushort *)(pbVar43 + uVar37 + 2);
                uVar39 = (uint)*(ushort *)(pbVar43 + uVar37 + 4);
                local_98 = (ulong)*(ushort *)(pbVar43 + uVar37 + 6);
              }
              else {
                uVar37 = (ulong)(uint)(iVar25 * 4);
                uVar31 = (uint)pbVar43[uVar37 + 2];
                uVar33 = (ulong)pbVar43[uVar37 + 3];
                uVar36 = (uint)pbVar43[uVar37];
                uVar40 = (uint)pbVar43[uVar37 + 1];
              }
            }
LAB_00102a85:
            if ((fmt & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
              if (fmt == SPNG_FMT_RGBA16) {
                if ((ctx->ihdr).bit_depth != '\x10') {
                  uVar29 = uVar36;
                  local_ac = uVar40;
                  local_98 = uVar33;
                  uVar39 = uVar31;
                }
                *(short *)((long)out + lVar41) = (short)uVar29;
                *(short *)((long)out + lVar41 + 2) = (short)local_ac;
                *(short *)((long)out + lVar41 + 4) = (short)uVar39;
                *(short *)((long)out + lVar41 + 6) = (short)local_98;
              }
            }
            else {
              if ((ctx->ihdr).bit_depth == '\x10') {
                uVar36 = uVar29 >> 8;
                uVar40 = local_ac >> 8;
                uVar31 = uVar39 >> 8;
                uVar33 = local_98 >> 8;
              }
              *(char *)((long)out + lVar41) = (char)uVar36;
              *(char *)((long)out + lVar41 + 1) = (char)uVar40;
              *(char *)((long)out + lVar41 + 2) = (char)uVar31;
              if (fmt == SPNG_FMT_RGBA8) {
                *(char *)((long)out + lVar41 + 3) = (char)uVar33;
              }
            }
LAB_00102c87:
            lVar41 = lVar41 + lVar42;
            uVar38 = uVar38 + 1;
          } while (uVar38 != uVar32);
        }
        else {
          unpack_scanline((uchar *)out,pbVar43,width,(uint)(ctx->ihdr).bit_depth,fmt);
        }
      }
      else if (-1 < (char)uVar3) {
        memcpy(out,pbVar43,len_00 - 1);
      }
    }
LAB_00102ccf:
    if ((uVar3 & 1) != 0) {
      puVar8 = ctx->trns_px;
      uVar33 = (ulong)ctx->bytes_per_pixel;
      if ((int)fmt < 0x10) {
        if (fmt == SPNG_FMT_RGBA8) {
          if ((uVar32 != 0) && ((ctx->ihdr).color_type != '\0')) {
            lVar42 = 0;
            do {
              iVar25 = bcmp(pbVar43,puVar8,uVar33);
              if (iVar25 == 0) {
                *(undefined1 *)((long)out + lVar42 * 4 + 3) = 0;
              }
              pbVar43 = pbVar43 + uVar33;
              lVar42 = lVar42 + 1;
            } while (width != (uint)lVar42);
          }
        }
        else if (((fmt == SPNG_FMT_RGBA16) && (uVar32 != 0)) && ((ctx->ihdr).color_type != '\0')) {
          lVar42 = 0;
          do {
            iVar25 = bcmp(pbVar43,puVar8,uVar33);
            if (iVar25 == 0) {
              *(undefined2 *)((long)out + lVar42 * 8 + 6) = 0;
            }
            pbVar43 = pbVar43 + uVar33;
            lVar42 = lVar42 + 1;
          } while (width != (uint)lVar42);
        }
      }
      else {
        bVar16 = (ctx->ihdr).bit_depth;
        if (fmt == SPNG_FMT_GA8) {
          uVar26 = (uint)bVar16;
          if (uVar26 == 0x10) {
            if (uVar32 != 0) {
              lVar42 = 0;
              do {
                iVar25 = bcmp(pbVar43,puVar8,uVar33);
                if (iVar25 == 0) {
                  *(undefined1 *)((long)out + lVar42 * 2 + 1) = 0;
                }
                pbVar43 = pbVar43 + uVar33;
                lVar42 = lVar42 + 1;
              } while (width != (uint)lVar42);
            }
          }
          else if (uVar32 != 0) {
            lVar42 = 0;
            uVar22 = 8 - uVar26;
            do {
              bVar17 = *pbVar43;
              uVar39 = uVar22 - uVar26;
              uVar31 = uVar39;
              if (7 < uVar39) {
                uVar31 = 8 - uVar26;
              }
              pbVar43 = pbVar43 + (7 < uVar39);
              if (*puVar8 ==
                  (byte)(bVar17 >> ((byte)uVar22 & 0x1f) & ~(byte)(-1 << (bVar16 & 0x1f)))) {
                *(undefined1 *)((long)out + lVar42 * 2 + 1) = 0;
              }
              lVar42 = lVar42 + 1;
              uVar22 = uVar31;
            } while (width != (uint)lVar42);
          }
        }
        else if (fmt == SPNG_FMT_GA16) {
          if (bVar16 == 0x10) {
            if (uVar32 != 0) {
              lVar42 = 0;
              do {
                if (*(short *)pbVar43 == *(short *)puVar8) {
                  *(undefined2 *)((long)out + lVar42 * 4 + 2) = 0;
                }
                pbVar43 = pbVar43 + uVar33;
                lVar42 = lVar42 + 1;
              } while (width != (uint)lVar42);
            }
          }
          else if (uVar32 != 0) {
            uVar22 = 8 - bVar16;
            lVar42 = 0;
            uVar26 = uVar22;
            do {
              uVar39 = uVar26 - bVar16;
              uVar31 = uVar39;
              if (7 < uVar39) {
                uVar31 = uVar22;
              }
              if (*puVar8 ==
                  (byte)(*pbVar43 >> ((byte)uVar26 & 0x1f) & ~(byte)(-1 << (bVar16 & 0x1f)))) {
                *(undefined2 *)((long)out + lVar42 * 4 + 2) = 0;
              }
              lVar42 = lVar42 + 1;
              pbVar43 = pbVar43 + (7 < uVar39);
              uVar26 = uVar31;
            } while (width != (uint)lVar42);
          }
        }
      }
    }
    if ((uVar3 & 0x10) != 0) {
      if ((int)fmt < 4) {
        if (fmt == SPNG_FMT_RGBA8) {
          if (uVar32 != 0) {
            uVar33 = 0;
            do {
              uVar38 = uVar33 & 0xffffffff;
              bVar16 = *(byte *)((long)out + uVar38 + 1);
              bVar17 = *(byte *)((long)out + uVar38 + 2);
              bVar49 = *(byte *)((long)out + uVar38 + 3);
              uVar18 = sample_to_target((ushort)*(byte *)((long)out + uVar38),uVar24,
                                        (uint)(ctx->decode_sb).red_bits,8);
              uVar20 = sample_to_target((ushort)bVar16,uVar24,(uint)(ctx->decode_sb).green_bits,8);
              uVar21 = sample_to_target((ushort)bVar17,uVar24,(uint)(ctx->decode_sb).blue_bits,8);
              uVar19 = sample_to_target((ushort)bVar49,uVar24,(uint)(ctx->decode_sb).alpha_bits,8);
              *(char *)((long)out + uVar38) = (char)uVar18;
              *(char *)((long)out + uVar38 + 1) = (char)uVar20;
              *(char *)((long)out + uVar38 + 2) = (char)uVar21;
              *(char *)((long)out + uVar38 + 3) = (char)uVar19;
              uVar33 = uVar33 + 4;
            } while (uVar32 * 4 != uVar33);
          }
        }
        else if ((fmt == SPNG_FMT_RGBA16) && (uVar32 != 0)) {
          uVar33 = 0;
          do {
            uVar38 = uVar33 & 0xffffffff;
            uVar18 = *(uint16_t *)((long)out + uVar38 + 2);
            uVar20 = *(uint16_t *)((long)out + uVar38 + 4);
            uVar21 = *(uint16_t *)((long)out + uVar38 + 6);
            uVar19 = sample_to_target(*(uint16_t *)((long)out + uVar38),uVar24,
                                      (uint)(ctx->decode_sb).red_bits,0x10);
            uVar18 = sample_to_target(uVar18,uVar24,(uint)(ctx->decode_sb).green_bits,0x10);
            uVar20 = sample_to_target(uVar20,uVar24,(uint)(ctx->decode_sb).blue_bits,0x10);
            uVar21 = sample_to_target(uVar21,uVar24,(uint)(ctx->decode_sb).alpha_bits,0x10);
            *(uint16_t *)((long)out + uVar38) = uVar19;
            *(uint16_t *)((long)out + uVar38 + 2) = uVar18;
            *(uint16_t *)((long)out + uVar38 + 4) = uVar20;
            *(uint16_t *)((long)out + uVar38 + 6) = uVar21;
            uVar33 = uVar33 + 8;
          } while (uVar32 * 8 != uVar33);
        }
      }
      else if (fmt == SPNG_FMT_RGB8) {
        if (uVar32 != 0) {
          uVar33 = 0;
          do {
            uVar38 = uVar33 & 0xffffffff;
            bVar16 = *(byte *)((long)out + uVar38 + 1);
            bVar17 = *(byte *)((long)out + uVar38 + 2);
            uVar18 = sample_to_target((ushort)*(byte *)((long)out + uVar38),uVar24,
                                      (uint)(ctx->decode_sb).red_bits,8);
            uVar20 = sample_to_target((ushort)bVar16,uVar24,(uint)(ctx->decode_sb).green_bits,8);
            uVar21 = sample_to_target((ushort)bVar17,uVar24,(uint)(ctx->decode_sb).blue_bits,8);
            *(char *)((long)out + uVar38) = (char)uVar18;
            *(char *)((long)out + uVar38 + 1) = (char)uVar20;
            *(char *)((long)out + uVar38 + 2) = (char)uVar21;
            uVar33 = uVar33 + 3;
          } while (uVar32 * 3 != uVar33);
        }
      }
      else if (fmt == SPNG_FMT_G8) {
        if (uVar32 != 0) {
          uVar33 = 0;
          do {
            uVar18 = sample_to_target((ushort)*(byte *)((long)out + uVar33),uVar24,
                                      (uint)(ctx->decode_sb).grayscale_bits,8);
            *(char *)((long)out + uVar33) = (char)uVar18;
            uVar33 = uVar33 + 1;
          } while (uVar32 != uVar33);
        }
      }
      else if ((fmt == SPNG_FMT_GA8) && (uVar32 != 0)) {
        uVar33 = 0;
        do {
          uVar18 = sample_to_target((ushort)*(byte *)((long)out + (uVar33 & 0xffffffff)),uVar24,
                                    (uint)(ctx->decode_sb).grayscale_bits,8);
          *(char *)((long)out + (uVar33 & 0xffffffff)) = (char)uVar18;
          uVar33 = uVar33 + 2;
        } while (uVar32 * 2 != uVar33);
      }
    }
    if ((uVar3 & 2) != 0) {
      if (fmt == SPNG_FMT_RGBA8) {
        if (uVar32 != 0) {
          uVar33 = 0;
          do {
            uVar38 = uVar33 & 0xffffffff;
            *(char *)((long)out + uVar38) = (char)puVar7[*(byte *)((long)out + uVar38)];
            *(char *)((long)out + uVar38 + 1) = (char)puVar7[*(byte *)((long)out + uVar38 + 1)];
            *(char *)((long)out + uVar38 + 2) = (char)puVar7[*(byte *)((long)out + uVar38 + 2)];
            uVar33 = uVar33 + 4;
          } while (uVar32 << 2 != uVar33);
        }
      }
      else if (fmt == SPNG_FMT_RGBA16) {
        if (uVar32 != 0) {
          uVar33 = 0;
          do {
            uVar38 = uVar33 & 0xffffffff;
            uVar18 = puVar7[*(ushort *)((long)out + uVar38 + 2)];
            uVar20 = puVar7[*(ushort *)((long)out + uVar38 + 4)];
            *(uint16_t *)((long)out + uVar38) = puVar7[*(ushort *)((long)out + uVar38)];
            *(uint16_t *)((long)out + uVar38 + 2) = uVar18;
            *(uint16_t *)((long)out + uVar38 + 4) = uVar20;
            uVar33 = uVar33 + 8;
          } while (uVar32 << 3 != uVar33);
        }
      }
      else if ((fmt == SPNG_FMT_RGB8) && (uVar32 != 0)) {
        uVar33 = 0;
        do {
          uVar38 = uVar33 & 0xffffffff;
          *(char *)((long)out + uVar38) = (char)puVar7[*(byte *)((long)out + uVar38)];
          *(char *)((long)out + uVar38 + 1) = (char)puVar7[*(byte *)((long)out + uVar38 + 1)];
          *(char *)((long)out + uVar38 + 2) = (char)puVar7[*(byte *)((long)out + uVar38 + 2)];
          uVar33 = uVar33 + 3;
        } while (uVar32 * 3 != uVar33);
      }
    }
    puVar8 = ctx->prev_scanline;
    ctx->prev_scanline = ctx->scanline;
    ctx->scanline = puVar8;
    uVar22 = update_row_info(ctx);
    if (uVar22 == 0x4b) {
      if ((ctx->cur_chunk_bytes_left == 0) ||
         (uVar24 = discard_chunk_bytes(ctx,ctx->cur_chunk_bytes_left), uVar24 == 0)) {
        uVar6 = *(undefined4 *)&(ctx->current_chunk).field_0x14;
        (ctx->last_idat).crc = (ctx->current_chunk).crc;
        *(undefined4 *)&(ctx->last_idat).field_0x14 = uVar6;
        uVar5 = (ctx->current_chunk).length;
        uVar12 = (ctx->current_chunk).type[0];
        uVar13 = (ctx->current_chunk).type[1];
        uVar14 = (ctx->current_chunk).type[2];
        uVar15 = (ctx->current_chunk).type[3];
        (ctx->last_idat).offset = (ctx->current_chunk).offset;
        (ctx->last_idat).length = uVar5;
        (ctx->last_idat).type[0] = uVar12;
        (ctx->last_idat).type[1] = uVar13;
        (ctx->last_idat).type[2] = uVar14;
        (ctx->last_idat).type[3] = uVar15;
      }
      else {
        ctx->state = SPNG_STATE_INVALID;
        uVar22 = uVar24;
      }
    }
  }
  else {
    ctx->state = SPNG_STATE_INVALID;
  }
  return uVar22;
}

Assistant:

int spng_decode_scanline(spng_ctx *ctx, void *out, size_t len)
{
    if(ctx == NULL || out == NULL) return 1;

    if(ctx->state >= SPNG_STATE_EOI) return SPNG_EOI;

    struct decode_flags f = ctx->decode_flags;

    struct spng_row_info *ri = &ctx->row_info;
    const struct spng_subimage *sub = ctx->subimage;

    const struct spng_ihdr *ihdr = &ctx->ihdr;
    const uint16_t *gamma_lut = ctx->gamma_lut;
    unsigned char *trns_px = ctx->trns_px;
    const struct spng_sbit *sb = &ctx->decode_sb;
    const struct spng_plte_entry *plte = ctx->decode_plte.rgba;
    struct spng__iter iter = spng__iter_init(ihdr->bit_depth, ctx->scanline);

    const unsigned char *scanline;

    const int pass = ri->pass;
    const int fmt = ctx->fmt;
    const size_t scanline_width = sub[pass].scanline_width;
    const uint32_t width = sub[pass].width;
    uint32_t k;
    uint8_t r_8, g_8, b_8, a_8, gray_8;
    uint16_t r_16, g_16, b_16, a_16, gray_16;
    r_8=0; g_8=0; b_8=0; a_8=0; gray_8=0;
    r_16=0; g_16=0; b_16=0; a_16=0; gray_16=0;
    size_t pixel_size = 4; /* SPNG_FMT_RGBA8 */
    size_t pixel_offset = 0;
    unsigned char *pixel;
    unsigned processing_depth = ihdr->bit_depth;

    if(f.indexed) processing_depth = 8;

    if(fmt == SPNG_FMT_RGBA16) pixel_size = 8;
    else if(fmt == SPNG_FMT_RGB8) pixel_size = 3;

    if(len < sub[pass].out_width) return SPNG_EBUFSIZ;

    int ret = read_scanline(ctx);

    if(ret) return decode_err(ctx, ret);

    scanline = ctx->scanline;

    for(k=0; k < width; k++)
    {
        pixel = (unsigned char*)out + pixel_offset;
        pixel_offset += pixel_size;

        if(f.same_layout)
        {
            if(f.zerocopy) break;

            memcpy(out, scanline, scanline_width - 1);
            break;
        }

        if(f.unpack)
        {
            unpack_scanline(out, scanline, width, ihdr->bit_depth, fmt);
            break;
        }

        if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 6), 2);
                memcpy(&g_16, scanline + (k * 6) + 2, 2);
                memcpy(&b_16, scanline + (k * 6) + 4, 2);

                a_16 = 65535;
            }
            else /* == 8 */
            {
                if(fmt == SPNG_FMT_RGBA8)
                {
                    rgb8_row_to_rgba8(scanline, out, width);
                    break;
                }

                r_8 = scanline[k * 3];
                g_8 = scanline[k * 3 + 1];
                b_8 = scanline[k * 3 + 2];

                a_8 = 255;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_INDEXED)
        {
            uint8_t entry = 0;

            if(ihdr->bit_depth == 8)
            {
                if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
                {
                    expand_row(out, scanline, &ctx->decode_plte, width, fmt);
                    break;
                }

                entry = scanline[k];
            }
            else /* < 8 */
            {
                entry = get_sample(&iter);
            }

            if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
            {
                pixel[0] = plte[entry].red;
                pixel[1] = plte[entry].green;
                pixel[2] = plte[entry].blue;
                if(fmt == SPNG_FMT_RGBA8) pixel[3] = plte[entry].alpha;

                continue;
            }
            else /* RGBA16 */
            {
                r_16 = plte[entry].red;
                g_16 = plte[entry].green;
                b_16 = plte[entry].blue;
                a_16 = plte[entry].alpha;

                r_16 = (r_16 << 8) | r_16;
                g_16 = (g_16 << 8) | g_16;
                b_16 = (b_16 << 8) | b_16;
                a_16 = (a_16 << 8) | a_16;

                memcpy(pixel, &r_16, 2);
                memcpy(pixel + 2, &g_16, 2);
                memcpy(pixel + 4, &b_16, 2);
                memcpy(pixel + 6, &a_16, 2);

                continue;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 8), 2);
                memcpy(&g_16, scanline + (k * 8) + 2, 2);
                memcpy(&b_16, scanline + (k * 8) + 4, 2);
                memcpy(&a_16, scanline + (k * 8) + 6, 2);
            }
            else /* == 8 */
            {
                r_8 = scanline[k * 4];
                g_8 = scanline[k * 4 + 1];
                b_8 = scanline[k * 4 + 2];
                a_8 = scanline[k * 4 + 3];
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + k * 2, 2);

                if(f.apply_trns && ctx->trns.gray == gray_16) a_16 = 0;
                else a_16 = 65535;

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* <= 8 */
            {
                gray_8 = get_sample(&iter);

                if(f.apply_trns && ctx->trns.gray == gray_8) a_8 = 0;
                else a_8 = 255;

                r_8 = gray_8; g_8 = gray_8; b_8 = gray_8;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + (k * 4), 2);
                memcpy(&a_16, scanline + (k * 4) + 2, 2);

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* == 8 */
            {
                gray_8 = scanline[k * 2];
                a_8 = scanline[k * 2 + 1];

                r_8 = gray_8;
                g_8 = gray_8;
                b_8 = gray_8;
            }
        }


        if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
        {
            if(ihdr->bit_depth == 16)
            {
                r_8 = r_16 >> 8;
                g_8 = g_16 >> 8;
                b_8 = b_16 >> 8;
                a_8 = a_16 >> 8;
            }

            pixel[0] = r_8;
            pixel[1] = g_8;
            pixel[2] = b_8;

            if(fmt == SPNG_FMT_RGBA8) pixel[3] = a_8;
        }
        else if(fmt == SPNG_FMT_RGBA16)
        {
            if(ihdr->bit_depth != 16)
            {
                r_16 = r_8;
                g_16 = g_8;
                b_16 = b_8;
                a_16 = a_8;
            }

            memcpy(pixel, &r_16, 2);
            memcpy(pixel + 2, &g_16, 2);
            memcpy(pixel + 4, &b_16, 2);
            memcpy(pixel + 6, &a_16, 2);
        }
    }/* for(k=0; k < width; k++) */

    if(f.apply_trns) trns_row(out, scanline, trns_px, ctx->bytes_per_pixel, &ctx->ihdr, width, fmt);

    if(f.do_scaling) scale_row(out, width, fmt, processing_depth, sb);

    if(f.apply_gamma) gamma_correct_row(out, width, fmt, gamma_lut);

    /* The previous scanline is always defiltered */
    void *t = ctx->prev_scanline;
    ctx->prev_scanline = ctx->scanline;
    ctx->scanline = t;

    ret = update_row_info(ctx);

    if(ret == SPNG_EOI)
    {
        if(ctx->cur_chunk_bytes_left) /* zlib stream ended before an IDAT chunk boundary */
        {/* Discard the rest of the chunk */
            int error = discard_chunk_bytes(ctx, ctx->cur_chunk_bytes_left);
            if(error) return decode_err(ctx, error);
        }

        ctx->last_idat = ctx->current_chunk;
    }

    return ret;
}